

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall PClassActor::InitializeNativeDefaults(PClassActor *this)

{
  BYTE *pBVar1;
  PClassActor *this_local;
  
  PSymbolTable::SetParentTable
            (&(this->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
              Symbols,&(((this->super_PClass).ParentClass)->super_PStruct).super_PNamedType.
                       super_PCompoundType.super_PType.Symbols);
  if ((this->super_PClass).Defaults != (BYTE *)0x0) {
    __assert_fail("Defaults == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/info.cpp"
                  ,0x16d,"void PClassActor::InitializeNativeDefaults()");
  }
  pBVar1 = (BYTE *)M_Malloc_Dbg((ulong)*(uint *)&(this->super_PClass).super_PStruct.super_PNamedType
                                                 .super_PCompoundType.super_PType.super_DObject.
                                                 field_0x24,
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/info.cpp"
                                ,0x16e);
  (this->super_PClass).Defaults = pBVar1;
  if (((this->super_PClass).ParentClass)->Defaults == (BYTE *)0x0) {
    memset((this->super_PClass).Defaults,0,
           (ulong)*(uint *)&(this->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                            super_PType.super_DObject.field_0x24);
  }
  else {
    memcpy((this->super_PClass).Defaults,((this->super_PClass).ParentClass)->Defaults,
           (ulong)*(uint *)&(((this->super_PClass).ParentClass)->super_PStruct).super_PNamedType.
                            super_PCompoundType.super_PType.super_DObject.field_0x24);
    if (*(uint *)&(((this->super_PClass).ParentClass)->super_PStruct).super_PNamedType.
                  super_PCompoundType.super_PType.super_DObject.field_0x24 <
        *(uint *)&(this->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                  super_PType.super_DObject.field_0x24) {
      memset((this->super_PClass).Defaults +
             *(uint *)&(((this->super_PClass).ParentClass)->super_PStruct).super_PNamedType.
                       super_PCompoundType.super_PType.super_DObject.field_0x24,0,
             (ulong)(uint)(*(int *)&(this->super_PClass).super_PStruct.super_PNamedType.
                                    super_PCompoundType.super_PType.super_DObject.field_0x24 -
                          *(int *)&(((this->super_PClass).ParentClass)->super_PStruct).
                                   super_PNamedType.super_PCompoundType.super_PType.super_DObject.
                                   field_0x24));
    }
  }
  return;
}

Assistant:

void PClassActor::InitializeNativeDefaults()
{
	Symbols.SetParentTable(&ParentClass->Symbols);
	assert(Defaults == NULL);
	Defaults = (BYTE *)M_Malloc(Size);
	if (ParentClass->Defaults != NULL) 
	{
		memcpy(Defaults, ParentClass->Defaults, ParentClass->Size);
		if (Size > ParentClass->Size)
		{
			memset(Defaults + ParentClass->Size, 0, Size - ParentClass->Size);
		}
	}
	else
	{
		memset (Defaults, 0, Size);
	}
}